

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LispPrint.cpp
# Opt level: O2

shared_ptr<Form> buildList(shared_ptr<Form> *forms,int count)

{
  element_type *peVar1;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  shared_ptr<Form> sVar2;
  __shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::make_shared<Form>();
  peVar1 = (forms->super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar1->kind = PAIR;
  std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&peVar1->pair[0].super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_00000034,count))
  ;
  if (in_EDX == 1) {
    std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_28,
               &gSymbolTable.empty_pair.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>);
    peVar1 = (forms->super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  else {
    buildList((shared_ptr<Form> *)&_Stack_28,count + 0x10);
    peVar1 = (forms->super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  std::__shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&peVar1->pair[1].super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  sVar2.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)forms;
  return (shared_ptr<Form>)sVar2.super___shared_ptr<Form,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Form> buildList(std::shared_ptr<Form>* forms, int count) {
  auto f = std::make_shared<Form>();
  f->kind = FormKind::PAIR;
  f->pair[0] = forms[0];
  if(count - 1) {
    f->pair[1] = buildList(forms + 1, count - 1);
  } else {
    f->pair[1] = gSymbolTable.getEmptyPair();
  }

  return f;
}